

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey
          (ExtPrivkey *this,NetType network_type,ByteData *parent_fingerprint,Privkey *privkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num)

{
  bool bVar1;
  CfdException *pCVar2;
  uint32_t uVar3;
  allocator local_1e9;
  string local_1e8;
  int ret;
  ByteData256 *local_1c0;
  Privkey *local_1b8;
  ByteData256 *local_1b0;
  ByteData256 *local_1a8;
  ByteData *local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fingerprint_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chain_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_bytes;
  Pubkey pubkey;
  undefined1 local_f0 [32];
  undefined1 local_d0 [20];
  uint8_t local_bc;
  uchar local_b1;
  undefined1 local_b0 [32];
  uint32_t local_90;
  undefined1 local_8c [20];
  uint32_t local_78;
  undefined1 local_71 [65];
  
  local_1a8 = chain_code;
  local_1a0 = parent_fingerprint;
  ByteData::ByteData(&this->serialize_data_);
  this->child_num_ = 0;
  local_1b0 = &this->chaincode_;
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  ByteData256::ByteData256(local_1b0);
  local_1b8 = &this->privkey_;
  Privkey::Privkey(local_1b8);
  local_1c0 = &this->tweak_sum_;
  ByteData256::ByteData256(local_1c0);
  bVar1 = Privkey::IsValid(privkey);
  if (!bVar1) {
    local_f0._0_8_ = "cfdcore_hdwallet.cpp";
    local_f0._8_4_ = 0x230;
    local_f0._16_8_ = (long)"Constructor_ExtPrivkey" + 0xc;
    logger::warn<>((CfdSourceLocation *)local_f0,"invalid privkey.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_f0,"Failed to privkey. ExtPrivkey invalid privkey.",
               (allocator *)&local_1e8);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_f0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar3 = 0x4358394;
  if (network_type == kMainnet) {
    uVar3 = 0x488ade4;
  }
  if (network_type == kLiquidV1) {
    uVar3 = 0x488ade4;
  }
  memset(local_f0,0,0xc0);
  local_90 = child_num;
  local_bc = depth;
  local_78 = uVar3;
  Privkey::GeneratePubkey(&pubkey,privkey,true);
  Privkey::GetData((ByteData *)&local_1e8,privkey);
  ByteData::GetBytes(&privkey_bytes,(ByteData *)&local_1e8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  Pubkey::GetData((ByteData *)&local_1e8,&pubkey);
  ByteData::GetBytes(&pubkey_bytes,(ByteData *)&local_1e8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  HashUtil::Hash160((ByteData160 *)&local_1e8,&pubkey);
  ByteData160::GetBytes(&pubkey_hash,(ByteData160 *)&local_1e8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  ByteData::GetBytes(&fingerprint_bytes,local_1a0);
  ByteData256::GetData((ByteData *)&local_1e8,local_1a8);
  ByteData::GetBytes(&chain_bytes,(ByteData *)&local_1e8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
  local_b1 = '\0';
  memcpy(local_b0,privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  memcpy(local_71,pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&fingerprint_bytes,4);
  memcpy(local_d0,fingerprint_bytes.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
         (long)fingerprint_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)fingerprint_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  memcpy(local_8c,pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  memcpy(local_f0,chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,0x4e,(allocator_type *)&local_1e8);
  ret = bip32_key_serialize((ext_key *)local_f0,0,
                            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData::ByteData((ByteData *)&local_1e8,&data);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_1e8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
    ByteData256::ByteData256((ByteData256 *)&local_1e8);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&local_1c0->data_);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
    AnalyzeBip32KeyData(local_f0,(string *)0x0,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,&this->version_
                        ,&this->depth_,&this->child_num_,local_1b0,local_1b8,(Pubkey *)0x0,
                        &this->fingerprint_);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&fingerprint_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
    ;
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
    return;
  }
  local_1e8._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_1e8._M_string_length._0_4_ = 0x253;
  local_1e8.field_2._M_allocated_capacity = (long)"Constructor_ExtPrivkey" + 0xc;
  logger::warn<int&>((CfdSourceLocation *)&local_1e8,"bip32_key_serialize error. ret={}",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_1e8,"ExtPrivkey serialize error.",&local_1e9);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_1e8);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey::ExtPrivkey(
    NetType network_type, const ByteData& parent_fingerprint,
    const Privkey& privkey, const ByteData256& chain_code, uint8_t depth,
    uint32_t child_num) {
  if (!privkey.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid privkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to privkey. ExtPrivkey invalid privkey.");
  }

  // create simple parent data
  struct ext_key extkey = {};
  memset(&extkey, 0, sizeof(extkey));
  extkey.version = kVersionTestnetPrivkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    extkey.version = kVersionMainnetPrivkey;
  }
  extkey.depth = depth;
  extkey.child_num = child_num;
  Pubkey pubkey = privkey.GeneratePubkey(true);
  std::vector<uint8_t> privkey_bytes = privkey.GetData().GetBytes();
  std::vector<uint8_t> pubkey_bytes = pubkey.GetData().GetBytes();
  std::vector<uint8_t> pubkey_hash = HashUtil::Hash160(pubkey).GetBytes();
  std::vector<uint8_t> fingerprint_bytes = parent_fingerprint.GetBytes();
  std::vector<uint8_t> chain_bytes = chain_code.GetData().GetBytes();
  extkey.priv_key[0] = BIP32_FLAG_KEY_PRIVATE;
  memcpy(&extkey.priv_key[1], privkey_bytes.data(), privkey_bytes.size());
  memcpy(extkey.pub_key, pubkey_bytes.data(), pubkey_bytes.size());
  // parent160: use top 4-byte only
  fingerprint_bytes.resize(4);
  memcpy(extkey.parent160, fingerprint_bytes.data(), fingerprint_bytes.size());
  memcpy(extkey.hash160, pubkey_hash.data(), pubkey_hash.size());
  memcpy(extkey.chain_code, chain_bytes.data(), chain_bytes.size());

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  int ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PRIVATE, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);
  tweak_sum_ = ByteData256();

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      &privkey_, nullptr, &fingerprint_);
}